

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

void __thiscall TTD::EventLog::InitForTTDRecord(EventLog *this,bool debug)

{
  PropertyId PVar1;
  PropertyRecord *pPVar2;
  BaseDictionary<Js::PropertyRecord*,Js::PropertyRecord*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
  *this_00;
  undefined7 in_register_00000031;
  int propertyId;
  PropertyRecord *local_48;
  PropertyRecord *local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000031,debug);
  propertyId = 0x2d9;
  PVar1 = ThreadContext::GetMaxPropertyId(this->m_threadContext);
  if (0x2d9 < PVar1) {
    do {
      pPVar2 = ThreadContext::GetPropertyName(this->m_threadContext,propertyId);
      this_00 = (BaseDictionary<Js::PropertyRecord*,Js::PropertyRecord*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                 *)Memory::
                   RecyclerRootPtr<JsUtil::BaseHashSet<Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                   ::operator->(&this->m_propertyRecordPinSet);
      local_48 = pPVar2;
      local_40 = pPVar2;
      JsUtil::
      BaseDictionary<Js::PropertyRecord*,Js::PropertyRecord*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<Js::PropertyRecord*,Js::PropertyRecord*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                (this_00,&local_48,&local_40);
      propertyId = propertyId + 1;
      PVar1 = ThreadContext::GetMaxPropertyId(this->m_threadContext);
    } while (propertyId < PVar1);
  }
  TTModeStack::SetAt(&this->m_modeStack,0,RecordMode);
  UpdateComputedMode(this);
  if ((char)local_34 != '\0') {
    TTModeStack::Push(&this->m_modeStack,DebuggerAttachedMode);
    UpdateComputedMode(this);
  }
  return;
}

Assistant:

void EventLog::InitForTTDRecord(bool debug)
    {
        //pin all the current properties so they don't move/disappear on us
        for(Js::PropertyId pid = TotalNumberOfBuiltInProperties; pid < this->m_threadContext->GetMaxPropertyId(); ++pid)
        {
            const Js::PropertyRecord* pRecord = this->m_threadContext->GetPropertyName(pid);
            this->AddPropertyRecord(pRecord);
        }

        this->SetGlobalMode(TTDMode::RecordMode);
        if (debug)
        {
            this->PushMode(TTDMode::DebuggerAttachedMode);
        }
    }